

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<const_wchar_t_*>::Matcher(Matcher<const_wchar_t_*> *this,wchar_t *value)

{
  Matcher<const_wchar_t_*> *in_RDI;
  Matcher<const_wchar_t_*> *in_stack_ffffffffffffffa8;
  EqMatcher<const_wchar_t_*> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<const_wchar_t_*>::MatcherBase((MatcherBase<const_wchar_t_*> *)0x12836d);
  (in_RDI->super_MatcherBase<const_wchar_t_*>)._vptr_MatcherBase =
       (_func_int **)&PTR__Matcher_002695d8;
  Eq<wchar_t_const*>((wchar_t *)in_stack_ffffffffffffffa8);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~Matcher((Matcher<const_wchar_t_*> *)0x1283c3);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }